

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O3

int mbedtls_ecdh_make_public
              (mbedtls_ecdh_context *ctx,size_t *olen,uchar *buf,size_t blen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  byte bVar1;
  int iVar2;
  mbedtls_ecp_point *Q;
  uint local_34;
  
  iVar2 = -0x4f80;
  if ((ctx->var == MBEDTLS_ECDH_VARIANT_MBEDTLS_2_0) && (*(long *)((long)&ctx->ctx + 0x78) != 0)) {
    bVar1 = ctx->point_format;
    Q = &(ctx->ctx).mbed_ecdh.Q;
    iVar2 = mbedtls_ecdh_gen_public(&(ctx->ctx).mbed_ecdh.grp,&(ctx->ctx).mbed_ecdh.d,Q,f_rng,p_rng)
    ;
    if (iVar2 == 0) {
      local_34 = (uint)bVar1;
      iVar2 = mbedtls_ecp_tls_write_point(&(ctx->ctx).mbed_ecdh.grp,Q,local_34,olen,buf,blen);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_ecdh_make_public(mbedtls_ecdh_context *ctx, size_t *olen,
                             unsigned char *buf, size_t blen,
                             int (*f_rng)(void *, unsigned char *, size_t),
                             void *p_rng)
{
    int restart_enabled = 0;
#if defined(MBEDTLS_ECP_RESTARTABLE)
    restart_enabled = ctx->restart_enabled;
#endif

#if defined(MBEDTLS_ECDH_LEGACY_CONTEXT)
    return ecdh_make_public_internal(ctx, olen, ctx->point_format, buf, blen,
                                     f_rng, p_rng, restart_enabled);
#else
    switch (ctx->var) {
#if defined(MBEDTLS_ECDH_VARIANT_EVEREST_ENABLED)
        case MBEDTLS_ECDH_VARIANT_EVEREST:
            return mbedtls_everest_make_public(&ctx->ctx.everest_ecdh, olen,
                                               buf, blen, f_rng, p_rng);
#endif
        case MBEDTLS_ECDH_VARIANT_MBEDTLS_2_0:
            return ecdh_make_public_internal(&ctx->ctx.mbed_ecdh, olen,
                                             ctx->point_format, buf, blen,
                                             f_rng, p_rng,
                                             restart_enabled);
        default:
            return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }
#endif
}